

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

void __thiscall
kratos::Generator::copy_over_missing_ports(Generator *this,shared_ptr<kratos::Generator> *ref)

{
  size_t *this_00;
  long *plVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  Port *this_01;
  _Base_ptr p_Var5;
  undefined1 local_a8 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70 [3];
  shared_ptr<kratos::Generator> *local_58;
  undefined1 local_50 [8];
  shared_ptr<kratos::Param> param;
  shared_ptr<kratos::Port> port;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a8,
             &(((ref->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              ports_)._M_t);
  this_00 = &port_names._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_58 = ref;
  for (p_Var5 = port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 != (_Rb_tree_node_base *)&port_names;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    bVar2 = has_port(this,(string *)(p_Var5 + 1));
    if (!bVar2) {
      get_port((Generator *)
               &param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (string *)
               (ref->super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      this_01 = Generator::port(this,*(PortDirection *)
                                      &param.
                                       super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi[0x27]._vptr__Sp_counted_base,
                                (string *)(p_Var5 + 1),
                                param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi[9]._M_use_count,
                                (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                (param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 10),
                                *(PortType *)
                                 ((long)&param.
                                         super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi[0x27]._vptr__Sp_counted_base + 4),
                                *(bool *)&param.
                                          super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi[0xf]._vptr__Sp_counted_base);
      plVar1 = *(long **)&param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi[0x1e]._M_use_count;
      if (plVar1 != (long *)0x0) {
        cVar3 = (**(code **)(*plVar1 + 0xd8))(plVar1);
        if (cVar3 != '\0') {
          (**(code **)(**(long **)&param.
                                   super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi[0x1e]._M_use_count + 0xf8))(this_00);
          get_param((Generator *)local_50,(string *)this);
          std::__cxx11::string::~string((string *)this_00);
          if (local_50 != (undefined1  [8])0x0) {
            std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<kratos::Param,void>
                      ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)this_00,
                       (__shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2> *)local_50);
            Var::set_width_param(&this_01->super_Var,(shared_ptr<kratos::Var> *)this_00);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_70);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&param);
          ref = local_58;
        }
      }
      uVar4 = (*(param.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)->_vptr__Sp_counted_base[0x18])();
      (*(this_01->super_Var).super_IRNode._vptr_IRNode[0x19])(this_01,(ulong)(uVar4 & 0xff));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&port);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8);
  return;
}

Assistant:

void Generator::copy_over_missing_ports(const std::shared_ptr<Generator> &ref) {
    auto port_names = ref->get_port_names();
    for (auto const &port_name : port_names) {
        if (has_port(port_name)) continue;
        auto port = ref->get_port(port_name);
        auto &p = this->port(port->port_direction(), port_name, port->var_width(), port->size(),
                             port->port_type(), port->is_signed());
        if (port->width_param() && port->width_param()->is_param()) {
            auto param = this->get_param(port->width_param()->to_string());
            if (param) {
                p.set_width_param(param);
            }
        }
        p.set_is_packed(port->is_packed());
    }
}